

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
          (JavascriptPromiseAllResolveElementFunction *this,DynamicType *type)

{
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,
             (FunctionInfo *)JavascriptPromise::EntryInfo::AllResolveElementFunction);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0152e3d8;
  (this->capabilities).ptr = (JavascriptPromiseCapability *)0x0;
  this->index = 0;
  (this->remainingElementsWrapper).ptr =
       (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)0x0;
  (this->values).ptr = (JavascriptArray *)0x0;
  this->alreadyCalled = false;
  return;
}

Assistant:

JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction(DynamicType* type)
        : RuntimeFunction(type, &Js::JavascriptPromise::EntryInfo::AllResolveElementFunction), index(0), values(nullptr), capabilities(nullptr), remainingElementsWrapper(nullptr), alreadyCalled(false)
    { }